

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void createlabel(LexState *ls,TString *name,int line,int last)

{
  FuncState *fs_00;
  int iVar1;
  Labellist *l_00;
  int l;
  Labellist *ll;
  FuncState *fs;
  int last_local;
  int line_local;
  TString *name_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  l_00 = &ls->dyd->label;
  iVar1 = luaK_getlabel(fs_00);
  iVar1 = newlabelentry(ls,l_00,name,line,iVar1);
  if (last != 0) {
    l_00->arr[iVar1].nactvar = fs_00->bl->nactvar;
  }
  return;
}

Assistant:

static void createlabel (LexState *ls, TString *name, int line, int last) {
  FuncState *fs = ls->fs;
  Labellist *ll = &ls->dyd->label;
  int l = newlabelentry(ls, ll, name, line, luaK_getlabel(fs));
  if (last) {  /* label is last no-op statement in the block? */
    /* assume that locals are already out of scope */
    ll->arr[l].nactvar = fs->bl->nactvar;
  }
}